

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string *name)

{
  bool bVar1;
  long lVar2;
  Symbol SVar3;
  string prefix;
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&prefix,(string *)name);
  do {
    lVar2 = std::__cxx11::string::rfind((char)&prefix,0x2e);
    if (lVar2 == -1) {
      if (this->underlay_ == (DescriptorPool *)0x0) {
        bVar1 = false;
      }
      else {
        bVar1 = IsSubSymbolOfBuiltType(this->underlay_,name);
      }
      goto LAB_00296ca3;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)&prefix);
    std::__cxx11::string::operator=((string *)&prefix,local_50);
    std::__cxx11::string::~string(local_50);
    SVar3 = Tables::FindSymbol((this->tables_)._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               .
                               super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                               ._M_head_impl,&prefix);
  } while (((undefined1  [16])SVar3 & (undefined1  [16])0xfffffff7) == (undefined1  [16])0x0);
  bVar1 = true;
LAB_00296ca3:
  std::__cxx11::string::~string((string *)&prefix);
  return bVar1;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(const std::string& name) const {
  std::string prefix = name;
  for (;;) {
    std::string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == std::string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}